

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_else(Parser *parser)

{
  List *list;
  void *data;
  BlockStmt *block;
  ElseStmt *pEVar1;
  
  expect(parser,ELSE);
  if (parser->token->kind == IF) {
    list = new_list();
    data = parse_if(parser);
    list_add(list,data);
    block = new_block_stmt(list);
  }
  else {
    block = (BlockStmt *)parse_block(parser);
  }
  pEVar1 = new_else_stmt(block);
  return pEVar1;
}

Assistant:

void *parse_else(Parser *parser) {
    expect(parser, ELSE);
    if (token(parser)->kind == IF) {
        /**
         * if(expr){                 if(expr){
         *
         *
         * }else if(expr){   ==>     }else{
         *                               if(expr){
         *
         *                               }
         * }                         }
         *
         *
         */
        List* block = new_list();
        list_add(block, parse_if(parser));
        return new_else_stmt(new_block_stmt(block));
    }
    return new_else_stmt(parse_block(parser));
}